

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgenfil.cpp
# Opt level: O2

void CTcIdFixup::load_object_file
               (CVmFile *fp,void *xlat,ulong xlat_cnt,tcgen_xlat_type xlat_type,
               size_t stream_element_size,textchar_t *fname,CTcIdFixup **fixup_list_head)

{
  ulong uVar1;
  CTcDataStream *this;
  ulong uVar2;
  ulong ofs;
  ulong unaff_R15;
  bool bVar3;
  char buf [9];
  
  uVar1 = CVmFile::read_uint4(fp);
  do {
    while( true ) {
      do {
        bVar3 = uVar1 == 0;
        uVar1 = uVar1 - 1;
        if (bVar3) {
          return;
        }
        CVmFile::read_bytes(fp,buf,9);
        this = CTcDataStream::get_stream_from_id(buf[0],fname);
      } while (this == (CTcDataStream *)0x0);
      uVar2 = (ulong)(uint)buf._5_4_;
      ofs = (ulong)(uint)buf._1_4_ + this->obj_file_start_ofs_;
      if (xlat != (void *)0x0) break;
LAB_001d5962:
      unaff_R15 = uVar2;
      if (fixup_list_head != (CTcIdFixup **)0x0) {
        add_fixup(fixup_list_head,this,ofs,uVar2);
      }
    }
    if (uVar2 < xlat_cnt) {
      if (xlat_type == TCGEN_XLAT_ENUM) {
        unaff_R15 = *(ulong *)((long)xlat + uVar2 * 8);
      }
      else if (xlat_type == TCGEN_XLAT_PROP) {
        unaff_R15 = (ulong)*(ushort *)((long)xlat + uVar2 * 2);
      }
      else if (xlat_type == TCGEN_XLAT_OBJ) {
        unaff_R15 = (ulong)*(uint *)((long)xlat + uVar2 * 4);
      }
      uVar2 = unaff_R15;
      if (stream_element_size == 2) {
        CTcDataStream::write2_at(this,ofs,(uint)unaff_R15);
      }
      else {
        CTcDataStream::write4_at(this,ofs,unaff_R15);
      }
      goto LAB_001d5962;
    }
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2e22,fname);
  } while( true );
}

Assistant:

void CTcIdFixup::load_object_file(CVmFile *fp,
                                  const void *xlat,
                                  ulong xlat_cnt,
                                  tcgen_xlat_type xlat_type,
                                  size_t stream_element_size,
                                  const textchar_t *fname,
                                  CTcIdFixup **fixup_list_head)
{
    ulong cnt;

    /* read the count, then read the fixups */
    for (cnt = fp->read_uint4() ; cnt != 0 ; --cnt)
    {
        char buf[9];
        ulong ofs;
        ulong old_id;
        ulong new_id;
        CTcDataStream *stream;

        /* read the next fixup */
        fp->read_bytes(buf, 9);
        stream = CTcDataStream::get_stream_from_id(buf[0], fname);
        ofs = t3rp4u(buf+1);
        old_id = t3rp4u(buf+5);

        /* if the stream was invalid, ignore this record */
        if (stream == 0)
            continue;

        /* adjust the offset for the stream's start in this object file */
        ofs += stream->get_object_file_start_ofs();

        /* apply the fixup if a translation table was provided */
        if (xlat != 0)
        {
            /* make sure the count is in range - if it's not, ignore it */
            if (old_id >= xlat_cnt)
            {
                /* note the problem */
                G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                    TCERR_OBJFILE_INVAL_OBJ_ID, fname);

                /* ignore the record */
                continue;
            }

            /* look up the new ID */
            switch(xlat_type)
            {
            case TCGEN_XLAT_OBJ:
                new_id = ((const tctarg_obj_id_t *)xlat)[old_id];
                break;

            case TCGEN_XLAT_PROP:
                new_id = ((const tctarg_prop_id_t *)xlat)[old_id];
                break;

            case TCGEN_XLAT_ENUM:
                new_id = ((const ulong *)xlat)[old_id];
                break;
            }

            /* apply the fixup */
            if (stream_element_size == 2)
                stream->write2_at(ofs, (uint)new_id);
            else
                stream->write4_at(ofs, new_id);
        }
        else
        {
            /* use the original ID for now */
            new_id = old_id;
        }

        /* 
         *   If we're keeping object fixups in the new file, create a fixup
         *   for the reference.  Note that the fixup is for the new ID, not
         *   the old ID, because we've already translated the value in the
         *   stream to the new ID.  
         */
        if (fixup_list_head != 0)
            CTcIdFixup::add_fixup(fixup_list_head, stream, ofs, new_id);
    }
}